

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpretdfd.c
# Opt level: O3

InterpretDFDResult
interpretDFD(uint32_t *DFD,InterpretedDFDChannel *R,InterpretedDFDChannel *G,
            InterpretedDFDChannel *B,InterpretedDFDChannel *A,uint32_t *wordBytes)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  uint32_t uVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  InterpretDFDResult IVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  InterpretDFDResult IVar15;
  uint uVar16;
  uint32_t uVar17;
  uint uVar18;
  InterpretedDFDChannel *pIVar19;
  uint uVar20;
  ulong uVar21;
  bool bVar22;
  
  uVar14 = (DFD[2] >> 0x12) - 6;
  if (uVar14 < 4) {
    return i_UNSUPPORTED_CHANNEL_TYPES;
  }
  R->offset = 0;
  R->size = 0;
  G->offset = 0;
  G->size = 0;
  B->offset = 0;
  B->size = 0;
  A->offset = 0;
  A->size = 0;
  if (0xff < DFD[5]) {
    return i_UNSUPPORTED_MULTIPLE_PLANES;
  }
  if (DFD[6] != 0) {
    return i_UNSUPPORTED_MULTIPLE_PLANES;
  }
  uVar14 = uVar14 >> 2;
  uVar21 = (ulong)(uVar14 + (uVar14 == 0));
  lVar5 = uVar21 << 4;
  lVar9 = 0;
  IVar15 = i_PACKED_FORMAT_BIT;
  do {
    uVar7 = *(uint *)((long)DFD + lVar9 + 0x1c);
    if (((uVar7 & 7) != 0) || (((uVar7 >> 0x10) + 1 & 7) != 0)) goto LAB_001c8c37;
    lVar9 = lVar9 + 0x10;
  } while (lVar5 != lVar9);
  IVar15 = i_LITTLE_ENDIAN_FORMAT_BIT;
LAB_001c8c37:
  uVar7 = DFD[3] & 0xff;
  lVar9 = 0;
  uVar18 = 0;
  uVar20 = 0;
  uVar10 = 0;
  uVar12 = 0;
  do {
    uVar16 = DFD[lVar9 + 7];
    if ((int)uVar16 < 0) {
      bVar6 = (float)DFD[(ulong)((int)lVar9 + 9U & 0xfffffffd) + 1] != 1.0;
      uVar13 = 0;
    }
    else {
      uVar2 = DFD[(ulong)((int)lVar9 + 9U & 0xfffffffd) + 1];
      bVar6 = uVar2 < (((uVar16 & 0x40000000) == 0) + 1 << ((byte)(uVar16 >> 0x10) & 0x1f)) - 1 &&
              1 < uVar2;
      uVar13 = (uint)bVar6;
      bVar6 = (bool)(~bVar6 & uVar2 != 1);
    }
    uVar18 = uVar18 | (uVar16 & 0x40000000) >> 0x1e;
    uVar12 = uVar12 | uVar13;
    uVar20 = uVar20 | uVar16 >> 0x1f;
    uVar10 = (uint)(byte)((byte)uVar10 | (uVar16 & 0xff0000) != 0 & bVar6);
    lVar9 = lVar9 + 4;
  } while (uVar21 << 2 != lVar9);
  IVar11 = uVar12 * 0x20 + uVar10 * 8 | uVar20 << 6 | uVar18 << 4 | IVar15;
  if (uVar7 == 2) {
    IVar11 = IVar11 | (i_YUVSDA_FORMAT_BIT|i_COMPRESSED_FORMAT_BIT|i_NORMALIZED_FORMAT_BIT);
    lVar9 = 0;
    bVar6 = false;
    do {
      uVar12 = *(byte *)((long)DFD + lVar9 + 0x1f) & 0xf;
      if (0xf < uVar12) {
        return i_UNSUPPORTED_CHANNEL_TYPES;
      }
      if ((0x8007U >> uVar12 & 1) == 0) {
        if ((0x6000U >> uVar12 & 1) == 0) {
          return i_UNSUPPORTED_CHANNEL_TYPES;
        }
        bVar6 = true;
      }
      lVar9 = lVar9 + 0x10;
    } while (lVar5 != lVar9);
    lVar5 = 0;
    uVar12 = 0;
    do {
      bVar1 = *(byte *)((long)DFD + lVar5 + 0x1e);
      uVar10 = bVar1 + 1;
      if (bVar1 < uVar12) {
        uVar10 = uVar12;
      }
      uVar12 = uVar10;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(uVar14 + (uVar14 == 0)) << 4 != lVar5);
    iVar8 = 0;
    do {
      uVar10 = 1 << ((byte)iVar8 & 0x1f);
      if (uVar12 - 1 < uVar10) goto LAB_001c8df6;
      iVar8 = iVar8 + 1;
    } while (iVar8 != 0x20);
    uVar10 = 0;
LAB_001c8df6:
    *wordBytes = (uVar10 << (sbyte)IVar15) >> 3;
  }
  else {
    if (uVar7 != 1) {
      return i_UNSUPPORTED_CHANNEL_TYPES;
    }
    if ((DFD[3] & 0xff0000) == 0x20000) {
      IVar11 = IVar11 | i_SRGB_FORMAT_BIT;
    }
    lVar9 = 0;
    do {
      if (*(int *)((long)DFD + lVar9 + 0x20) != 0) {
        return i_UNSUPPORTED_MULTIPLE_SAMPLE_LOCATIONS;
      }
      lVar9 = lVar9 + 0x10;
    } while (lVar5 != lVar9);
    bVar6 = false;
  }
  if (1 < uVar7 - 1) {
    return i_UNSUPPORTED_CHANNEL_TYPES;
  }
  lVar5 = 0;
  do {
    bVar3 = bVar6;
    bVar22 = (*(byte *)((long)DFD + lVar5 + 0x1f) & 0xf) - 0xd < 2;
    bVar6 = (bool)(bVar3 | bVar22);
    lVar5 = lVar5 + 0x10;
  } while ((ulong)(uVar14 + (uVar14 == 0)) << 4 != lVar5);
  if (!(bool)(bVar3 | bVar22)) {
    lVar5 = 0;
    do {
      uVar12 = *(uint *)((long)DFD + lVar5 + 0x1c);
      if (SUB41(uVar18,0) == ((uVar12 >> 0x1e & 1) == 0)) {
        return i_UNSUPPORTED_MIXED_CHANNELS;
      }
      if (-1 < (int)uVar12 == SUB41(uVar20,0)) {
        return i_UNSUPPORTED_MIXED_CHANNELS;
      }
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(uVar14 + (uVar14 == 0)) << 4 != lVar5);
  }
  if ((IVar11 & i_PACKED_FORMAT_BIT) == i_LITTLE_ENDIAN_FORMAT_BIT) {
    uVar12 = 0xffffffff;
    lVar5 = 0;
    bVar3 = false;
    uVar10 = 0;
    uVar18 = 0;
    do {
      uVar20 = *(uint *)((long)DFD + lVar5 + 0x1c);
      uVar16 = uVar20 >> 0x18 & 0xf;
      if (uVar16 < 0xd) {
        pIVar19 = R;
        if (((uVar16 != 0) && (pIVar19 = G, uVar16 != 1)) && (pIVar19 = B, uVar16 != 2)) {
          return i_UNSUPPORTED_CHANNEL_TYPES;
        }
      }
      else {
        pIVar19 = G;
        if (((uVar16 != 0xd) && (pIVar19 = R, uVar16 != 0xe)) && (pIVar19 = A, uVar16 != 0xf)) {
          return i_UNSUPPORTED_CHANNEL_TYPES;
        }
      }
      uVar13 = uVar20 >> 3 & 0x1fff;
      uVar20 = (uVar20 >> 0x10 & 0xff) + 1 >> 3;
      if (uVar16 == uVar12) {
        if (uVar13 == uVar10 - 1) {
          if ((bVar3) && ((IVar11 & i_BIG_ENDIAN_FORMAT_BIT) == i_LITTLE_ENDIAN_FORMAT_BIT)) {
            return i_UNSUPPORTED_ERROR_BIT;
          }
          IVar11 = IVar11 | i_BIG_ENDIAN_FORMAT_BIT;
          pIVar19->offset = uVar13;
        }
        else {
          if (uVar13 != uVar18 + uVar10) {
            return i_UNSUPPORTED_ERROR_BIT;
          }
          if ((bVar3) && ((IVar11 & i_BIG_ENDIAN_FORMAT_BIT) != i_LITTLE_ENDIAN_FORMAT_BIT)) {
            return i_UNSUPPORTED_ERROR_BIT;
          }
        }
        uVar4 = pIVar19->size + uVar20;
        pIVar19->size = uVar4;
        bVar3 = true;
      }
      else {
        if (pIVar19->size != 0) {
          if (uVar7 != 2) {
            return i_UNSUPPORTED_ERROR_BIT;
          }
          if (uVar16 != 0) {
            return i_UNSUPPORTED_ERROR_BIT;
          }
          if ((pIVar19 == R) && (pIVar19 = A, A->size != 0)) {
            return i_UNSUPPORTED_CHANNEL_TYPES;
          }
        }
        pIVar19->offset = uVar13;
        pIVar19->size = uVar20;
        uVar12 = uVar16;
        uVar4 = uVar20;
      }
      *wordBytes = uVar4;
      lVar5 = lVar5 + 0x10;
      uVar10 = uVar13;
      uVar18 = uVar20;
    } while ((ulong)(uVar14 + (uVar14 == 0)) << 4 != lVar5);
  }
  else {
    *wordBytes = (uint)(byte)DFD[5];
    uVar12 = 0xffffffff;
    lVar5 = 0;
    uVar4 = 0;
    uVar10 = 0;
    uVar18 = 0;
    do {
      uVar20 = *(uint *)((long)DFD + lVar5 + 0x1c);
      uVar16 = uVar20 >> 0x18 & 0xf;
      if (uVar16 < 0xd) {
        pIVar19 = R;
        if (((uVar16 != 0) && (pIVar19 = G, uVar16 != 1)) && (pIVar19 = B, uVar16 != 2)) {
          return i_UNSUPPORTED_CHANNEL_TYPES;
        }
      }
      else {
        pIVar19 = G;
        if (((uVar16 != 0xd) && (pIVar19 = R, uVar16 != 0xe)) && (pIVar19 = A, uVar16 != 0xf)) {
          return i_UNSUPPORTED_CHANNEL_TYPES;
        }
      }
      uVar13 = uVar20 & 0xffff;
      uVar17 = (uVar20 >> 0x10 & 0xff) + 1;
      if (uVar16 == uVar12) {
        if (uVar13 >> 3 != uVar10 - 1) {
          return i_UNSUPPORTED_ERROR_BIT;
        }
        if (((uVar20 | uVar4 + uVar18) & 7) != 0) {
          return i_UNSUPPORTED_ERROR_BIT;
        }
        IVar11 = IVar11 | i_BIG_ENDIAN_FORMAT_BIT;
        pIVar19->size = pIVar19->size + uVar17;
      }
      else {
        if (pIVar19->size != 0) {
          if (uVar7 != 2) {
            return i_UNSUPPORTED_ERROR_BIT;
          }
          if (uVar16 != 0) {
            return i_UNSUPPORTED_ERROR_BIT;
          }
          if ((pIVar19 == R) && (pIVar19 = A, A->size != 0)) {
            return i_UNSUPPORTED_CHANNEL_TYPES;
          }
        }
        pIVar19->offset = uVar13;
        pIVar19->size = uVar17;
        uVar12 = uVar16;
      }
      lVar5 = lVar5 + 0x10;
      uVar4 = uVar17;
      uVar10 = uVar13 >> 3;
      uVar18 = uVar13;
    } while ((ulong)(uVar14 + (uVar14 == 0)) << 4 != lVar5);
    if ((IVar11 & i_BIG_ENDIAN_FORMAT_BIT) != i_LITTLE_ENDIAN_FORMAT_BIT) {
      uVar14 = *wordBytes * 8 - 8;
      R->offset = R->offset ^ uVar14;
      G->offset = G->offset ^ uVar14;
      B->offset = B->offset ^ uVar14;
      A->offset = A->offset ^ uVar14;
    }
  }
  if (!bVar6) {
    return IVar11;
  }
  uVar14 = G->size;
  if (G->size < R->size) {
    uVar14 = R->size;
  }
  iVar8 = 0;
  do {
    uVar7 = 1 << ((byte)iVar8 & 0x1f);
    if (uVar14 - 1 < uVar7) goto LAB_001c91d0;
    iVar8 = iVar8 + 1;
  } while (iVar8 != 0x20);
  uVar7 = 0;
LAB_001c91d0:
  *wordBytes = uVar7;
  return IVar11;
}

Assistant:

enum InterpretDFDResult interpretDFD(const uint32_t *DFD,
                                     InterpretedDFDChannel *R,
                                     InterpretedDFDChannel *G,
                                     InterpretedDFDChannel *B,
                                     InterpretedDFDChannel *A,
                                     uint32_t *wordBytes)
{
    /* DFD points to the whole descriptor, not the basic descriptor block. */
    /* Make everything else relative to the basic descriptor block. */
    const uint32_t *BDFDB = DFD+1;

    uint32_t numSamples = KHR_DFDSAMPLECOUNT(BDFDB);
    if (numSamples == 0)
        return i_UNSUPPORTED_CHANNEL_TYPES;

    int determinedEndianness = 0;
    enum InterpretDFDResult result = 0; /* Build this up incrementally. */

    bool isDepthStencil = false;

    /* Clear these so following code doesn't get confused. */
    R->offset = R->size = 0;
    G->offset = G->size = 0;
    B->offset = B->size = 0;
    A->offset = A->size = 0;

    /* First rule out the multiple planes case (trivially) */
    /* - that is, we check that only bytesPlane0 is non-zero. */
    /* This means we don't handle multi-plane YUV, even if the API could. */
    /* (We rely on KHR_DF_WORD_BYTESPLANE0..3 being the same and */
    /* KHR_DF_WORD_BYTESPLANE4..7 being the same as a short cut.) */
    if ((BDFDB[KHR_DF_WORD_BYTESPLANE0] & ~KHR_DF_MASK_BYTESPLANE0)
        || BDFDB[KHR_DF_WORD_BYTESPLANE4]) return i_UNSUPPORTED_MULTIPLE_PLANES;

    /* If this is a packed format, we work out our offsets differently. */
    /* We assume a packed format has channels that aren't byte-aligned. */
    /* If we have a format in which every channel is byte-aligned *and* packed, */
    /* we have the RGBA/ABGR ambiguity; we *probably* don't want the packed */
    /* version in this case, and if hardware has to pack it and swizzle, */
    /* that's up to the hardware to special-case. */
    for (uint32_t sampleCounter = 0; sampleCounter < numSamples; ++sampleCounter) {
        uint32_t offset = KHR_DFDSVAL(BDFDB, sampleCounter, BITOFFSET);
        uint32_t length = KHR_DFDSVAL(BDFDB, sampleCounter, BITLENGTH) + 1;
        if ((offset & 0x7U) || ((offset + length) & 0x7U)) {
            result |= i_PACKED_FORMAT_BIT;
            /* Once we're packed, we're packed, no need to keep checking. */
            break;
        }
    }

    // Check data types.
    bool hasSigned = false;
    bool hasFloat = false;
    bool hasNormalized = false;
    bool hasFixed = false;
    khr_df_model_e model = KHR_DFDVAL(BDFDB, MODEL);

    // Note: We're ignoring 9995, which is weird and worth special-casing
    // rather than trying to generalise to all float formats.
    for (uint32_t i = 0; i < numSamples; ++i) {
        const bool isSigned = (KHR_DFDSVAL(BDFDB, i, QUALIFIERS) & KHR_DF_SAMPLE_DATATYPE_SIGNED) != 0;
        const bool isFloat = (KHR_DFDSVAL(BDFDB, i, QUALIFIERS) & KHR_DF_SAMPLE_DATATYPE_FLOAT) != 0;

        // We define "unnormalized" as "sample_upper = 1" or "sample_upper = 1.0f".
        // We don't check whether any non-1 normalization value is correct
        // (i.e. set to the maximum bit value, and check min value) on
        // the assumption that we're looking at a format which *came* from
        // an API we can support.
        bool isFixed;
        bool isNormalized;
        if (isFloat) {
            isNormalized = *(float*) (void*) &BDFDB[KHR_DF_WORD_SAMPLESTART +
                    KHR_DF_WORD_SAMPLEWORDS * i +
                    KHR_DF_SAMPLEWORD_SAMPLEUPPER] != 1.0f;
            isFixed = false;
        } else {
            uint32_t sampleUpper = KHR_DFDSVAL(BDFDB, i, SAMPLEUPPER);
            uint32_t maxVal = 1U << KHR_DFDSVAL(BDFDB, i, BITLENGTH);
            if (!isSigned) maxVal <<= 1;
            maxVal--;
            isFixed = 1U < sampleUpper && sampleUpper < maxVal;
            isNormalized = !isFixed && sampleUpper != 1U;
        }
        hasSigned |= isSigned;
        hasFixed |= isFixed;
        hasFloat |= isFloat;
        // By our definition the normalizedness of a single bit channel (like in RGBA 5:5:5:1)
        // is ambiguous. Ignore these during normalized checks.
        if (KHR_DFDSVAL(BDFDB, i, BITLENGTH) > 0)
            hasNormalized |= isNormalized;
    }
    result |= hasSigned ? i_SIGNED_FORMAT_BIT : 0;
    result |= hasFloat ? i_FLOAT_FORMAT_BIT : 0;
    result |= hasNormalized ? i_NORMALIZED_FORMAT_BIT : 0;
    result |= hasFixed ? i_FIXED_FORMAT_BIT : 0;

    // Checks based on color model
    if (model == KHR_DF_MODEL_YUVSDA) {
        result |= i_NORMALIZED_FORMAT_BIT;
        result |= i_COMPRESSED_FORMAT_BIT;
        result |= i_YUVSDA_FORMAT_BIT;

        for (uint32_t i = 0; i < numSamples; ++i) {
            switch (KHR_DFDSVAL(BDFDB, i, CHANNELID)) {
            case KHR_DF_CHANNEL_YUVSDA_Y:
            case KHR_DF_CHANNEL_YUVSDA_U:
            case KHR_DF_CHANNEL_YUVSDA_V:
            case KHR_DF_CHANNEL_YUVSDA_A:
                break;
            case KHR_DF_CHANNEL_YUVSDA_DEPTH:
            case KHR_DF_CHANNEL_YUVSDA_STENCIL:
                isDepthStencil = true;
                break;
            default:
                return i_UNSUPPORTED_CHANNEL_TYPES;
            }
        }

        // Determine wordBytes
        uint32_t largestSampleSize = 0;
        for (uint32_t i = 0; i < numSamples; ++i) {
            uint32_t length = KHR_DFDSVAL(BDFDB, i, BITLENGTH) + 1;
            if (largestSampleSize < length)
                largestSampleSize = length;
        }
        *wordBytes = ((result & i_PACKED_FORMAT_BIT) ? 4 : 1) * bit_ceil(largestSampleSize) / 8;

    } else if (KHR_DFDVAL(BDFDB, MODEL) == KHR_DF_MODEL_RGBSDA) {
        /* Check if transfer is sRGB. */
        if (KHR_DFDVAL(BDFDB, TRANSFER) == KHR_DF_TRANSFER_SRGB) result |= i_SRGB_FORMAT_BIT;

        /* We only support samples at coordinate 0,0,0,0. */
        /* (We could confirm this from texel_block_dimensions in 1.2, but */
        /* the interpretation might change in later versions.) */
        for (uint32_t sampleCounter = 0; sampleCounter < numSamples; ++sampleCounter) {
            if (KHR_DFDSVAL(BDFDB, sampleCounter, SAMPLEPOSITION_ALL))
                return i_UNSUPPORTED_MULTIPLE_SAMPLE_LOCATIONS;
        }
    }

    if (model == KHR_DF_MODEL_RGBSDA || model == KHR_DF_MODEL_YUVSDA) {
        /* The values of the DEPTH and STENCIL tokens are the same for */
        /* RGBSDA and YUVSDA. */
        /* For Depth/Stencil formats mixed channels are allowed */
        for (uint32_t sampleCounter = 0; sampleCounter < numSamples; ++sampleCounter) {
            switch (KHR_DFDSVAL(BDFDB, sampleCounter, CHANNELID)) {
            case KHR_DF_CHANNEL_RGBSDA_DEPTH:
            case KHR_DF_CHANNEL_RGBSDA_STENCIL:
                isDepthStencil = true;
                break;
            default:
                break;
            }
        }

        // Check for mixed channels
        if (!isDepthStencil) {
            for (uint32_t i = 0; i < numSamples; ++i) {
                const bool isSigned = (KHR_DFDSVAL(BDFDB, i, QUALIFIERS) & KHR_DF_SAMPLE_DATATYPE_SIGNED) != 0;
                const bool isFloat = (KHR_DFDSVAL(BDFDB, i, QUALIFIERS) & KHR_DF_SAMPLE_DATATYPE_FLOAT) != 0;

                if (isSigned != hasSigned)
                    return i_UNSUPPORTED_MIXED_CHANNELS;
                if (isFloat != hasFloat)
                    return i_UNSUPPORTED_MIXED_CHANNELS;

                // Note: We don't check for inconsistent normalization, because
                // channels composed of multiple samples will have 0 in the
                // lower/upper range. Single bit channels are also ambiguous.
                // This heuristic should handle 64-bit integers, too.
            }
        }

        /* This all relies on the channel id values for RGB being equal to */
        /* those for YUV. */

        /* Remember: the canonical ordering of samples is to start with */
        /* the lowest bit of the channel/location which touches bit 0 of */
        /* the data, when the latter is concatenated in little-endian order, */
        /* and then progress until all the bits of that channel/location */
        /* have been processed. Multiple channels sharing the same source */
        /* bits are processed in channel ID order. (I should clarify this */
        /* for partially-shared data, but it doesn't really matter so long */
        /* as everything is consecutive, except to make things canonical.) */
        /* Note: For standard formats we could determine big/little-endianness */
        /* simply from whether the first sample starts in bit 0; technically */
        /* it's possible to have a format with unaligned channels wherein the */
        /* first channel starts at bit 0 and is one byte, yet other channels */
        /* take more bytes or aren't aligned (e.g. D24S8), but this should be */
        /* irrelevant for the formats that we support. */
        if ((result & i_PACKED_FORMAT_BIT)) {
            /* A packed format. */
            uint32_t currentChannel = ~0U; /* Don't start matched. */
            uint32_t currentBitOffset = 0;
            uint32_t currentByteOffset = 0;
            uint32_t currentBitLength = 0;
            *wordBytes = (BDFDB[KHR_DF_WORD_BYTESPLANE0] & 0xFFU);
            for (uint32_t sampleCounter = 0; sampleCounter < numSamples; ++sampleCounter) {
                uint32_t sampleBitOffset = KHR_DFDSVAL(BDFDB, sampleCounter, BITOFFSET);
                uint32_t sampleByteOffset = sampleBitOffset >> 3U;
                /* The sample bitLength field stores the bit length - 1. */
                uint32_t sampleBitLength = KHR_DFDSVAL(BDFDB, sampleCounter, BITLENGTH) + 1;
                uint32_t sampleChannel = KHR_DFDSVAL(BDFDB, sampleCounter, CHANNELID);
                InterpretedDFDChannel *sampleChannelPtr;
                switch (sampleChannel) {
                case KHR_DF_CHANNEL_RGBSDA_RED:
                    sampleChannelPtr = R;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_GREEN:
                    sampleChannelPtr = G;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_BLUE:
                    sampleChannelPtr = B;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_DEPTH:
                    sampleChannelPtr = R;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_STENCIL:
                    sampleChannelPtr = G;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_ALPHA:
                    sampleChannelPtr = A;
                    break;
                default:
                    return i_UNSUPPORTED_CHANNEL_TYPES;
                }
                if (sampleChannel == currentChannel) {
                    /* Continuation of the same channel. */
                    /* Since a big (>32-bit) channel isn't "packed", */
                    /* this should only happen in big-endian, or if */
                    /* we have a wacky format that we won't support. */
                    if (sampleByteOffset == currentByteOffset - 1U && /* One byte earlier */
                        ((currentBitOffset + currentBitLength) & 7U) == 0 && /* Already at the end of a byte */
                        (sampleBitOffset & 7U) == 0) { /* Start at the beginning of the byte */
                        /* All is good, continue big-endian. */
                        /* N.B. We shouldn't be here if we decided we were little-endian, */
                        /* so we don't bother to check that disagreement. */
                        result |= i_BIG_ENDIAN_FORMAT_BIT;
                        determinedEndianness = 1;
                    } else {
                        /* Oh dear. */
                        /* We could be little-endian, but not with any standard format. */
                        /* More likely we've got something weird that we can't support. */
                        return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                    }
                    /* Remember where we are. */
                    currentBitOffset = sampleBitOffset;
                    currentByteOffset = sampleByteOffset;
                    currentBitLength = sampleBitLength;
                    /* Accumulate the bit length. */
                    sampleChannelPtr->size += sampleBitLength;
                } else {
                    /* Everything is new. Hopefully. */
                    currentChannel = sampleChannel;
                    currentBitOffset = sampleBitOffset;
                    currentByteOffset = sampleByteOffset;
                    currentBitLength = sampleBitLength;
                    if (sampleChannelPtr->size) {
                        if (model == KHR_DF_MODEL_YUVSDA && sampleChannel == KHR_DF_CHANNEL_YUVSDA_Y) {
                            if (sampleChannelPtr == R) {
                                /* We've got another Y channel. Record details in A. */
                                if (A->size == 0) {
                                    sampleChannelPtr = A;
                                } else {
                                    /* Uh-oh, we've already got a second Y or an alpha channel. */
                                    return i_UNSUPPORTED_CHANNEL_TYPES;
                                }
                            }
                        } else {
                          /* Uh-oh, we've seen this channel before. */
                          return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                        }
                    }
                    /* For now, record the bit offset in little-endian terms, */
                    /* because we may not know to reverse it yet. */
                    sampleChannelPtr->offset = sampleBitOffset;
                    sampleChannelPtr->size = sampleBitLength;
                }
            }
            if ((result & i_BIG_ENDIAN_FORMAT_BIT)) {
                /* Our bit offsets to bit 0 of each channel are in little-endian terms. */
                /* We need to do a byte swap to work out where they should be. */
                /* We assume, for sanity, that byte sizes are a power of two for this. */
                uint32_t offsetMask = (*wordBytes - 1U) << 3U;
                R->offset ^= offsetMask;
                G->offset ^= offsetMask;
                B->offset ^= offsetMask;
                A->offset ^= offsetMask;
            }
        } else {
            /* Not a packed format. */
            /* Everything is byte-aligned. */
            /* Question is whether there multiple samples per channel. */
            uint32_t currentChannel = ~0U; /* Don't start matched. */
            uint32_t currentByteOffset = 0;
            uint32_t currentByteLength = 0;
            for (uint32_t sampleCounter = 0; sampleCounter < numSamples; ++sampleCounter) {
                uint32_t sampleByteOffset = KHR_DFDSVAL(BDFDB, sampleCounter, BITOFFSET) >> 3U;
                uint32_t sampleByteLength = (KHR_DFDSVAL(BDFDB, sampleCounter, BITLENGTH) + 1) >> 3U;
                uint32_t sampleChannel = KHR_DFDSVAL(BDFDB, sampleCounter, CHANNELID);
                InterpretedDFDChannel *sampleChannelPtr;
                switch (sampleChannel) {
                case KHR_DF_CHANNEL_RGBSDA_RED:
                    sampleChannelPtr = R;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_GREEN:
                    sampleChannelPtr = G;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_BLUE:
                    sampleChannelPtr = B;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_DEPTH:
                    sampleChannelPtr = R;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_STENCIL:
                    sampleChannelPtr = G;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_ALPHA:
                    sampleChannelPtr = A;
                    break;
                default:
                    return i_UNSUPPORTED_CHANNEL_TYPES;
                }
                if (sampleChannel == currentChannel) {
                    /* Continuation of the same channel. */
                    /* Either big-endian, or little-endian with a very large channel. */
                    if (sampleByteOffset == currentByteOffset - 1) { /* One byte earlier */
                        if (determinedEndianness && !(result & i_BIG_ENDIAN_FORMAT_BIT)) {
                            return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                        }
                        /* All is good, continue big-endian. */
                        result |= i_BIG_ENDIAN_FORMAT_BIT;
                        determinedEndianness = 1;
                        /* Update the start */
                        sampleChannelPtr->offset = sampleByteOffset;
                    } else if (sampleByteOffset == currentByteOffset + currentByteLength) {
                        if (determinedEndianness && (result & i_BIG_ENDIAN_FORMAT_BIT)) {
                            return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                        }
                        /* All is good, continue little-endian. */
                        determinedEndianness = 1;
                    } else {
                        /* Oh dear. */
                        /* We could be little-endian, but not with any standard format. */
                        /* More likely we've got something weird that we can't support. */
                        return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                    }
                    /* Remember where we are. */
                    currentByteOffset = sampleByteOffset;
                    currentByteLength = sampleByteLength;
                    /* Accumulate the byte length. */
                    sampleChannelPtr->size += sampleByteLength;
                    /* Assume these are all the same. */
                    *wordBytes = sampleChannelPtr->size;
                } else {
                    /* Everything is new. Hopefully. */
                    currentChannel = sampleChannel;
                    currentByteOffset = sampleByteOffset;
                    currentByteLength = sampleByteLength;
                    if (sampleChannelPtr->size) {
                        if (model == KHR_DF_MODEL_YUVSDA && sampleChannel == KHR_DF_CHANNEL_YUVSDA_Y) {
                            if (sampleChannelPtr == R) {
                                /* We've got another Y channel. Record details in A. */
                                if (A->size == 0) {
                                    sampleChannelPtr = A;
                                } else {
                                    /* Uh-oh, we've already got a second Y or an alpha channel. */
                                    return i_UNSUPPORTED_CHANNEL_TYPES;
                                }
                            }
                        } else {
                          /* Uh-oh, we've seen this channel before. */
                          return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                        }
                    }
                    /* For now, record the byte offset in little-endian terms, */
                    /* because we may not know to reverse it yet. */
                    sampleChannelPtr->offset = sampleByteOffset;
                    sampleChannelPtr->size = sampleByteLength;
                    /* Assume these are all the same. */
                    *wordBytes = sampleByteLength;
                }
            }
        }
    } else {
        return i_UNSUPPORTED_CHANNEL_TYPES;
    }

    if (isDepthStencil) {
        /* For Depth/Stencil formats wordBytes is determined by the required alignment of */
        /* the larger channel. */
        uint32_t largerSize = R->size > G->size ? R->size : G->size;
        *wordBytes = bit_ceil(largerSize);
    }

    return result;
}